

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_pack8_fp16.h
# Opt level: O0

void ncnn::conv1x1s1_sgemm_transform_kernel_fp16_pack8_avx
               (Mat *kernel,Mat *weight_data_pack8,int num_input,int num_output)

{
  unsigned_short uVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  float *pfVar24;
  float *pfVar25;
  float *pfVar26;
  float *pfVar27;
  float *pfVar28;
  float *pfVar29;
  float *pfVar30;
  float *pfVar31;
  float *pfVar32;
  float *pfVar33;
  float *pfVar34;
  float *pfVar35;
  float *pfVar36;
  float *pfVar37;
  float *pfVar38;
  float *pfVar39;
  float *pfVar40;
  float *pfVar41;
  float *pfVar42;
  float *pfVar43;
  float *pfVar44;
  float *pfVar45;
  float *pfVar46;
  float *pfVar47;
  float *pfVar48;
  float *pfVar49;
  float *pfVar50;
  float *pfVar51;
  float *pfVar52;
  float *pfVar53;
  float *pfVar54;
  float *pfVar55;
  float *pfVar56;
  float *pfVar57;
  float *pfVar58;
  float *pfVar59;
  float *pfVar60;
  float *pfVar61;
  float *pfVar62;
  float *pfVar63;
  float *pfVar64;
  float *pfVar65;
  float *pfVar66;
  int in_ECX;
  int in_EDX;
  int iVar67;
  unsigned_short *g00;
  float *k77;
  float *k76;
  float *k75;
  float *k74;
  float *k73;
  float *k72;
  float *k71;
  float *k70;
  float *k67;
  float *k66;
  float *k65;
  float *k64;
  float *k63;
  float *k62;
  float *k61;
  float *k60;
  float *k57;
  float *k56;
  float *k55;
  float *k54;
  float *k53;
  float *k52;
  float *k51;
  float *k50;
  float *k47;
  float *k46;
  float *k45;
  float *k44;
  float *k43;
  float *k42;
  float *k41;
  float *k40;
  float *k37;
  float *k36;
  float *k35;
  float *k34;
  float *k33;
  float *k32;
  float *k31;
  float *k30;
  float *k27;
  float *k26;
  float *k25;
  float *k24;
  float *k23;
  float *k22;
  float *k21;
  float *k20;
  float *k17;
  float *k16;
  float *k15;
  float *k14;
  float *k13;
  float *k12;
  float *k11;
  float *k10;
  float *k07;
  float *k06;
  float *k05;
  float *k04;
  float *k03;
  float *k02;
  float *k01;
  float *k00;
  int p;
  Mat g0;
  Mat k7;
  Mat k6;
  Mat k5;
  Mat k4;
  Mat k3;
  Mat k2;
  Mat k1;
  Mat k0;
  int q;
  Mat weight_data_r2;
  int in_stack_fffffffffffff874;
  undefined2 in_stack_fffffffffffff878;
  undefined2 in_stack_fffffffffffff87a;
  undefined2 in_stack_fffffffffffff87c;
  undefined2 in_stack_fffffffffffff87e;
  int in_stack_fffffffffffff884;
  int in_stack_fffffffffffff888;
  int in_stack_fffffffffffff88c;
  undefined2 in_stack_fffffffffffff890;
  undefined2 in_stack_fffffffffffff892;
  unsigned_short in_stack_fffffffffffff894;
  unsigned_short in_stack_fffffffffffff896;
  unsigned_short in_stack_fffffffffffff898;
  unsigned_short in_stack_fffffffffffff89a;
  unsigned_short in_stack_fffffffffffff89c;
  unsigned_short in_stack_fffffffffffff89e;
  undefined2 in_stack_fffffffffffff8a0;
  undefined2 in_stack_fffffffffffff8a2;
  undefined2 in_stack_fffffffffffff8a4;
  undefined2 in_stack_fffffffffffff8a6;
  Allocator *in_stack_fffffffffffff910;
  undefined8 in_stack_fffffffffffff918;
  undefined8 in_stack_fffffffffffff920;
  Mat *in_stack_fffffffffffff928;
  int local_2fc;
  Mat local_2f8;
  Mat local_2b0;
  Mat local_268;
  Mat local_220;
  Mat local_1d8;
  Mat local_190;
  Mat local_148;
  Mat local_100;
  Mat local_b8;
  int local_70;
  int local_18;
  int local_14;
  
  local_18 = in_ECX;
  local_14 = in_EDX;
  Mat::reshape(in_stack_fffffffffffff928,(int)((ulong)in_stack_fffffffffffff920 >> 0x20),
               (int)in_stack_fffffffffffff920,(int)((ulong)in_stack_fffffffffffff918 >> 0x20),
               in_stack_fffffffffffff910);
  Mat::create((Mat *)CONCAT26(in_stack_fffffffffffff896,
                              CONCAT24(in_stack_fffffffffffff894,
                                       CONCAT22(in_stack_fffffffffffff892,in_stack_fffffffffffff890)
                                      )),in_stack_fffffffffffff88c,in_stack_fffffffffffff888,
              in_stack_fffffffffffff884,
              CONCAT26(in_stack_fffffffffffff87e,
                       CONCAT24(in_stack_fffffffffffff87c,
                                CONCAT22(in_stack_fffffffffffff87a,in_stack_fffffffffffff878))),
              in_stack_fffffffffffff874,
              (Allocator *)
              CONCAT26(in_stack_fffffffffffff8a6,
                       CONCAT24(in_stack_fffffffffffff8a4,
                                CONCAT22(in_stack_fffffffffffff8a2,in_stack_fffffffffffff8a0))));
  for (local_70 = 0; local_70 + 7 < local_18; local_70 = local_70 + 8) {
    Mat::channel((Mat *)CONCAT26(in_stack_fffffffffffff89e,
                                 CONCAT24(in_stack_fffffffffffff89c,
                                          CONCAT22(in_stack_fffffffffffff89a,
                                                   in_stack_fffffffffffff898))),
                 CONCAT22(in_stack_fffffffffffff896,in_stack_fffffffffffff894));
    Mat::channel((Mat *)CONCAT26(in_stack_fffffffffffff89e,
                                 CONCAT24(in_stack_fffffffffffff89c,
                                          CONCAT22(in_stack_fffffffffffff89a,
                                                   in_stack_fffffffffffff898))),
                 CONCAT22(in_stack_fffffffffffff896,in_stack_fffffffffffff894));
    Mat::channel((Mat *)CONCAT26(in_stack_fffffffffffff89e,
                                 CONCAT24(in_stack_fffffffffffff89c,
                                          CONCAT22(in_stack_fffffffffffff89a,
                                                   in_stack_fffffffffffff898))),
                 CONCAT22(in_stack_fffffffffffff896,in_stack_fffffffffffff894));
    Mat::channel((Mat *)CONCAT26(in_stack_fffffffffffff89e,
                                 CONCAT24(in_stack_fffffffffffff89c,
                                          CONCAT22(in_stack_fffffffffffff89a,
                                                   in_stack_fffffffffffff898))),
                 CONCAT22(in_stack_fffffffffffff896,in_stack_fffffffffffff894));
    Mat::channel((Mat *)CONCAT26(in_stack_fffffffffffff89e,
                                 CONCAT24(in_stack_fffffffffffff89c,
                                          CONCAT22(in_stack_fffffffffffff89a,
                                                   in_stack_fffffffffffff898))),
                 CONCAT22(in_stack_fffffffffffff896,in_stack_fffffffffffff894));
    Mat::channel((Mat *)CONCAT26(in_stack_fffffffffffff89e,
                                 CONCAT24(in_stack_fffffffffffff89c,
                                          CONCAT22(in_stack_fffffffffffff89a,
                                                   in_stack_fffffffffffff898))),
                 CONCAT22(in_stack_fffffffffffff896,in_stack_fffffffffffff894));
    Mat::channel((Mat *)CONCAT26(in_stack_fffffffffffff89e,
                                 CONCAT24(in_stack_fffffffffffff89c,
                                          CONCAT22(in_stack_fffffffffffff89a,
                                                   in_stack_fffffffffffff898))),
                 CONCAT22(in_stack_fffffffffffff896,in_stack_fffffffffffff894));
    Mat::channel((Mat *)CONCAT26(in_stack_fffffffffffff89e,
                                 CONCAT24(in_stack_fffffffffffff89c,
                                          CONCAT22(in_stack_fffffffffffff89a,
                                                   in_stack_fffffffffffff898))),
                 CONCAT22(in_stack_fffffffffffff896,in_stack_fffffffffffff894));
    Mat::channel((Mat *)CONCAT26(in_stack_fffffffffffff89e,
                                 CONCAT24(in_stack_fffffffffffff89c,
                                          CONCAT22(in_stack_fffffffffffff89a,
                                                   in_stack_fffffffffffff898))),
                 CONCAT22(in_stack_fffffffffffff896,in_stack_fffffffffffff894));
    for (local_2fc = 0; local_2fc + 7 < local_14; local_2fc = local_2fc + 8) {
      pfVar2 = Mat::row(&local_b8,local_2fc);
      pfVar3 = Mat::row(&local_b8,local_2fc + 1);
      pfVar4 = Mat::row(&local_b8,local_2fc + 2);
      pfVar5 = Mat::row(&local_b8,local_2fc + 3);
      pfVar6 = Mat::row(&local_b8,local_2fc + 4);
      pfVar7 = Mat::row(&local_b8,local_2fc + 5);
      pfVar8 = Mat::row(&local_b8,local_2fc + 6);
      pfVar9 = Mat::row(&local_b8,local_2fc + 7);
      pfVar10 = Mat::row(&local_100,local_2fc);
      pfVar11 = Mat::row(&local_100,local_2fc + 1);
      pfVar12 = Mat::row(&local_100,local_2fc + 2);
      pfVar13 = Mat::row(&local_100,local_2fc + 3);
      pfVar14 = Mat::row(&local_100,local_2fc + 4);
      pfVar15 = Mat::row(&local_100,local_2fc + 5);
      pfVar16 = Mat::row(&local_100,local_2fc + 6);
      pfVar17 = Mat::row(&local_100,local_2fc + 7);
      pfVar18 = Mat::row(&local_148,local_2fc);
      pfVar19 = Mat::row(&local_148,local_2fc + 1);
      pfVar20 = Mat::row(&local_148,local_2fc + 2);
      pfVar21 = Mat::row(&local_148,local_2fc + 3);
      pfVar22 = Mat::row(&local_148,local_2fc + 4);
      pfVar23 = Mat::row(&local_148,local_2fc + 5);
      pfVar24 = Mat::row(&local_148,local_2fc + 6);
      pfVar25 = Mat::row(&local_148,local_2fc + 7);
      pfVar26 = Mat::row(&local_190,local_2fc);
      pfVar27 = Mat::row(&local_190,local_2fc + 1);
      pfVar28 = Mat::row(&local_190,local_2fc + 2);
      pfVar29 = Mat::row(&local_190,local_2fc + 3);
      pfVar30 = Mat::row(&local_190,local_2fc + 4);
      pfVar31 = Mat::row(&local_190,local_2fc + 5);
      pfVar32 = Mat::row(&local_190,local_2fc + 6);
      pfVar33 = Mat::row(&local_190,local_2fc + 7);
      pfVar34 = Mat::row(&local_1d8,local_2fc);
      pfVar35 = Mat::row(&local_1d8,local_2fc + 1);
      pfVar36 = Mat::row(&local_1d8,local_2fc + 2);
      pfVar37 = Mat::row(&local_1d8,local_2fc + 3);
      pfVar38 = Mat::row(&local_1d8,local_2fc + 4);
      pfVar39 = Mat::row(&local_1d8,local_2fc + 5);
      pfVar40 = Mat::row(&local_1d8,local_2fc + 6);
      pfVar41 = Mat::row(&local_1d8,local_2fc + 7);
      pfVar42 = Mat::row(&local_220,local_2fc);
      pfVar43 = Mat::row(&local_220,local_2fc + 1);
      pfVar44 = Mat::row(&local_220,local_2fc + 2);
      pfVar45 = Mat::row(&local_220,local_2fc + 3);
      pfVar46 = Mat::row(&local_220,local_2fc + 4);
      pfVar47 = Mat::row(&local_220,local_2fc + 5);
      pfVar48 = Mat::row(&local_220,local_2fc + 6);
      pfVar49 = Mat::row(&local_220,local_2fc + 7);
      pfVar50 = Mat::row(&local_268,local_2fc);
      pfVar51 = Mat::row(&local_268,local_2fc + 1);
      pfVar52 = Mat::row(&local_268,local_2fc + 2);
      pfVar53 = Mat::row(&local_268,local_2fc + 3);
      pfVar54 = Mat::row(&local_268,local_2fc + 4);
      pfVar55 = Mat::row(&local_268,local_2fc + 5);
      pfVar56 = Mat::row(&local_268,local_2fc + 6);
      pfVar57 = Mat::row(&local_268,local_2fc + 7);
      pfVar58 = Mat::row(&local_2b0,local_2fc);
      pfVar59 = Mat::row(&local_2b0,local_2fc + 1);
      pfVar60 = Mat::row(&local_2b0,local_2fc + 2);
      pfVar61 = Mat::row(&local_2b0,local_2fc + 3);
      pfVar62 = Mat::row(&local_2b0,local_2fc + 4);
      pfVar63 = Mat::row(&local_2b0,local_2fc + 5);
      pfVar64 = Mat::row(&local_2b0,local_2fc + 6);
      pfVar65 = Mat::row(&local_2b0,local_2fc + 7);
      iVar67 = local_2fc;
      if (local_2fc < 0) {
        iVar67 = local_2fc + 7;
      }
      pfVar66 = Mat::row(&local_2f8,iVar67 >> 3);
      uVar1 = float32_to_float16(*pfVar2);
      *(unsigned_short *)pfVar66 = uVar1;
      uVar1 = float32_to_float16(*pfVar10);
      *(unsigned_short *)((long)pfVar66 + 2) = uVar1;
      uVar1 = float32_to_float16(*pfVar18);
      *(unsigned_short *)(pfVar66 + 1) = uVar1;
      uVar1 = float32_to_float16(*pfVar26);
      *(unsigned_short *)((long)pfVar66 + 6) = uVar1;
      uVar1 = float32_to_float16(*pfVar34);
      *(unsigned_short *)(pfVar66 + 2) = uVar1;
      uVar1 = float32_to_float16(*pfVar42);
      *(unsigned_short *)((long)pfVar66 + 10) = uVar1;
      uVar1 = float32_to_float16(*pfVar50);
      *(unsigned_short *)(pfVar66 + 3) = uVar1;
      uVar1 = float32_to_float16(*pfVar58);
      *(unsigned_short *)((long)pfVar66 + 0xe) = uVar1;
      uVar1 = float32_to_float16(*pfVar3);
      *(unsigned_short *)(pfVar66 + 4) = uVar1;
      uVar1 = float32_to_float16(*pfVar11);
      *(unsigned_short *)((long)pfVar66 + 0x12) = uVar1;
      uVar1 = float32_to_float16(*pfVar19);
      *(unsigned_short *)(pfVar66 + 5) = uVar1;
      uVar1 = float32_to_float16(*pfVar27);
      *(unsigned_short *)((long)pfVar66 + 0x16) = uVar1;
      uVar1 = float32_to_float16(*pfVar35);
      *(unsigned_short *)(pfVar66 + 6) = uVar1;
      uVar1 = float32_to_float16(*pfVar43);
      *(unsigned_short *)((long)pfVar66 + 0x1a) = uVar1;
      uVar1 = float32_to_float16(*pfVar51);
      *(unsigned_short *)(pfVar66 + 7) = uVar1;
      uVar1 = float32_to_float16(*pfVar59);
      *(unsigned_short *)((long)pfVar66 + 0x1e) = uVar1;
      uVar1 = float32_to_float16(*pfVar4);
      *(unsigned_short *)(pfVar66 + 8) = uVar1;
      uVar1 = float32_to_float16(*pfVar12);
      *(unsigned_short *)((long)pfVar66 + 0x22) = uVar1;
      uVar1 = float32_to_float16(*pfVar20);
      *(unsigned_short *)(pfVar66 + 9) = uVar1;
      uVar1 = float32_to_float16(*pfVar28);
      *(unsigned_short *)((long)pfVar66 + 0x26) = uVar1;
      uVar1 = float32_to_float16(*pfVar36);
      *(unsigned_short *)(pfVar66 + 10) = uVar1;
      uVar1 = float32_to_float16(*pfVar44);
      *(unsigned_short *)((long)pfVar66 + 0x2a) = uVar1;
      uVar1 = float32_to_float16(*pfVar52);
      *(unsigned_short *)(pfVar66 + 0xb) = uVar1;
      uVar1 = float32_to_float16(*pfVar60);
      *(unsigned_short *)((long)pfVar66 + 0x2e) = uVar1;
      uVar1 = float32_to_float16(*pfVar5);
      *(unsigned_short *)(pfVar66 + 0xc) = uVar1;
      uVar1 = float32_to_float16(*pfVar13);
      *(unsigned_short *)((long)pfVar66 + 0x32) = uVar1;
      uVar1 = float32_to_float16(*pfVar21);
      *(unsigned_short *)(pfVar66 + 0xd) = uVar1;
      uVar1 = float32_to_float16(*pfVar29);
      *(unsigned_short *)((long)pfVar66 + 0x36) = uVar1;
      uVar1 = float32_to_float16(*pfVar37);
      *(unsigned_short *)(pfVar66 + 0xe) = uVar1;
      uVar1 = float32_to_float16(*pfVar45);
      *(unsigned_short *)((long)pfVar66 + 0x3a) = uVar1;
      uVar1 = float32_to_float16(*pfVar53);
      *(unsigned_short *)(pfVar66 + 0xf) = uVar1;
      uVar1 = float32_to_float16(*pfVar61);
      *(unsigned_short *)((long)pfVar66 + 0x3e) = uVar1;
      uVar1 = float32_to_float16(*pfVar6);
      *(unsigned_short *)(pfVar66 + 0x10) = uVar1;
      uVar1 = float32_to_float16(*pfVar14);
      *(unsigned_short *)((long)pfVar66 + 0x42) = uVar1;
      uVar1 = float32_to_float16(*pfVar22);
      *(unsigned_short *)(pfVar66 + 0x11) = uVar1;
      uVar1 = float32_to_float16(*pfVar30);
      *(unsigned_short *)((long)pfVar66 + 0x46) = uVar1;
      uVar1 = float32_to_float16(*pfVar38);
      *(unsigned_short *)(pfVar66 + 0x12) = uVar1;
      uVar1 = float32_to_float16(*pfVar46);
      *(unsigned_short *)((long)pfVar66 + 0x4a) = uVar1;
      uVar1 = float32_to_float16(*pfVar54);
      *(unsigned_short *)(pfVar66 + 0x13) = uVar1;
      uVar1 = float32_to_float16(*pfVar62);
      *(unsigned_short *)((long)pfVar66 + 0x4e) = uVar1;
      in_stack_fffffffffffff89e = float32_to_float16(*pfVar7);
      *(unsigned_short *)(pfVar66 + 0x14) = in_stack_fffffffffffff89e;
      in_stack_fffffffffffff89c = float32_to_float16(*pfVar15);
      *(unsigned_short *)((long)pfVar66 + 0x52) = in_stack_fffffffffffff89c;
      in_stack_fffffffffffff89a = float32_to_float16(*pfVar23);
      *(unsigned_short *)(pfVar66 + 0x15) = in_stack_fffffffffffff89a;
      in_stack_fffffffffffff898 = float32_to_float16(*pfVar31);
      *(unsigned_short *)((long)pfVar66 + 0x56) = in_stack_fffffffffffff898;
      in_stack_fffffffffffff896 = float32_to_float16(*pfVar39);
      *(unsigned_short *)(pfVar66 + 0x16) = in_stack_fffffffffffff896;
      in_stack_fffffffffffff894 = float32_to_float16(*pfVar47);
      *(unsigned_short *)((long)pfVar66 + 0x5a) = in_stack_fffffffffffff894;
      uVar1 = float32_to_float16(*pfVar55);
      *(unsigned_short *)(pfVar66 + 0x17) = uVar1;
      uVar1 = float32_to_float16(*pfVar63);
      *(unsigned_short *)((long)pfVar66 + 0x5e) = uVar1;
      uVar1 = float32_to_float16(*pfVar8);
      *(unsigned_short *)(pfVar66 + 0x18) = uVar1;
      uVar1 = float32_to_float16(*pfVar16);
      *(unsigned_short *)((long)pfVar66 + 0x62) = uVar1;
      uVar1 = float32_to_float16(*pfVar24);
      *(unsigned_short *)(pfVar66 + 0x19) = uVar1;
      uVar1 = float32_to_float16(*pfVar32);
      *(unsigned_short *)((long)pfVar66 + 0x66) = uVar1;
      uVar1 = float32_to_float16(*pfVar40);
      *(unsigned_short *)(pfVar66 + 0x1a) = uVar1;
      uVar1 = float32_to_float16(*pfVar48);
      *(unsigned_short *)((long)pfVar66 + 0x6a) = uVar1;
      uVar1 = float32_to_float16(*pfVar56);
      *(unsigned_short *)(pfVar66 + 0x1b) = uVar1;
      uVar1 = float32_to_float16(*pfVar64);
      *(unsigned_short *)((long)pfVar66 + 0x6e) = uVar1;
      uVar1 = float32_to_float16(*pfVar9);
      *(unsigned_short *)(pfVar66 + 0x1c) = uVar1;
      uVar1 = float32_to_float16(*pfVar17);
      *(unsigned_short *)((long)pfVar66 + 0x72) = uVar1;
      uVar1 = float32_to_float16(*pfVar25);
      *(unsigned_short *)(pfVar66 + 0x1d) = uVar1;
      uVar1 = float32_to_float16(*pfVar33);
      *(unsigned_short *)((long)pfVar66 + 0x76) = uVar1;
      uVar1 = float32_to_float16(*pfVar41);
      *(unsigned_short *)(pfVar66 + 0x1e) = uVar1;
      uVar1 = float32_to_float16(*pfVar49);
      *(unsigned_short *)((long)pfVar66 + 0x7a) = uVar1;
      uVar1 = float32_to_float16(*pfVar57);
      *(unsigned_short *)(pfVar66 + 0x1f) = uVar1;
      uVar1 = float32_to_float16(*pfVar65);
      *(unsigned_short *)((long)pfVar66 + 0x7e) = uVar1;
    }
    Mat::~Mat((Mat *)0x1f0164);
    Mat::~Mat((Mat *)0x1f0171);
    Mat::~Mat((Mat *)0x1f017e);
    Mat::~Mat((Mat *)0x1f018b);
    Mat::~Mat((Mat *)0x1f0198);
    Mat::~Mat((Mat *)0x1f01a5);
    Mat::~Mat((Mat *)0x1f01b2);
    Mat::~Mat((Mat *)0x1f01bf);
    Mat::~Mat((Mat *)0x1f01cc);
  }
  Mat::~Mat((Mat *)0x1f0259);
  return;
}

Assistant:

static void conv1x1s1_sgemm_transform_kernel_fp16_pack8_avx(const Mat& kernel, Mat& weight_data_pack8, int num_input, int num_output)
{
    // src = kw-kh-inch-outch
    // dst = 8b-8a-kw-kh-inch/8a-outch/8b
    Mat weight_data_r2 = kernel.reshape(1, num_input, num_output);

    weight_data_pack8.create(1, num_input / 8, num_output / 8, (size_t)2 * 64, 64);

    for (int q = 0; q + 7 < num_output; q += 8)
    {
        const Mat k0 = weight_data_r2.channel(q);
        const Mat k1 = weight_data_r2.channel(q + 1);
        const Mat k2 = weight_data_r2.channel(q + 2);
        const Mat k3 = weight_data_r2.channel(q + 3);
        const Mat k4 = weight_data_r2.channel(q + 4);
        const Mat k5 = weight_data_r2.channel(q + 5);
        const Mat k6 = weight_data_r2.channel(q + 6);
        const Mat k7 = weight_data_r2.channel(q + 7);

        Mat g0 = weight_data_pack8.channel(q / 8);

        for (int p = 0; p + 7 < num_input; p += 8)
        {
            const float* k00 = k0.row(p);
            const float* k01 = k0.row(p + 1);
            const float* k02 = k0.row(p + 2);
            const float* k03 = k0.row(p + 3);
            const float* k04 = k0.row(p + 4);
            const float* k05 = k0.row(p + 5);
            const float* k06 = k0.row(p + 6);
            const float* k07 = k0.row(p + 7);

            const float* k10 = k1.row(p);
            const float* k11 = k1.row(p + 1);
            const float* k12 = k1.row(p + 2);
            const float* k13 = k1.row(p + 3);
            const float* k14 = k1.row(p + 4);
            const float* k15 = k1.row(p + 5);
            const float* k16 = k1.row(p + 6);
            const float* k17 = k1.row(p + 7);

            const float* k20 = k2.row(p);
            const float* k21 = k2.row(p + 1);
            const float* k22 = k2.row(p + 2);
            const float* k23 = k2.row(p + 3);
            const float* k24 = k2.row(p + 4);
            const float* k25 = k2.row(p + 5);
            const float* k26 = k2.row(p + 6);
            const float* k27 = k2.row(p + 7);

            const float* k30 = k3.row(p);
            const float* k31 = k3.row(p + 1);
            const float* k32 = k3.row(p + 2);
            const float* k33 = k3.row(p + 3);
            const float* k34 = k3.row(p + 4);
            const float* k35 = k3.row(p + 5);
            const float* k36 = k3.row(p + 6);
            const float* k37 = k3.row(p + 7);

            const float* k40 = k4.row(p);
            const float* k41 = k4.row(p + 1);
            const float* k42 = k4.row(p + 2);
            const float* k43 = k4.row(p + 3);
            const float* k44 = k4.row(p + 4);
            const float* k45 = k4.row(p + 5);
            const float* k46 = k4.row(p + 6);
            const float* k47 = k4.row(p + 7);

            const float* k50 = k5.row(p);
            const float* k51 = k5.row(p + 1);
            const float* k52 = k5.row(p + 2);
            const float* k53 = k5.row(p + 3);
            const float* k54 = k5.row(p + 4);
            const float* k55 = k5.row(p + 5);
            const float* k56 = k5.row(p + 6);
            const float* k57 = k5.row(p + 7);

            const float* k60 = k6.row(p);
            const float* k61 = k6.row(p + 1);
            const float* k62 = k6.row(p + 2);
            const float* k63 = k6.row(p + 3);
            const float* k64 = k6.row(p + 4);
            const float* k65 = k6.row(p + 5);
            const float* k66 = k6.row(p + 6);
            const float* k67 = k6.row(p + 7);

            const float* k70 = k7.row(p);
            const float* k71 = k7.row(p + 1);
            const float* k72 = k7.row(p + 2);
            const float* k73 = k7.row(p + 3);
            const float* k74 = k7.row(p + 4);
            const float* k75 = k7.row(p + 5);
            const float* k76 = k7.row(p + 6);
            const float* k77 = k7.row(p + 7);

            unsigned short* g00 = (unsigned short*)g0.row(p / 8);
            g00[0] = float32_to_float16(k00[0]);
            g00[1] = float32_to_float16(k10[0]);
            g00[2] = float32_to_float16(k20[0]);
            g00[3] = float32_to_float16(k30[0]);
            g00[4] = float32_to_float16(k40[0]);
            g00[5] = float32_to_float16(k50[0]);
            g00[6] = float32_to_float16(k60[0]);
            g00[7] = float32_to_float16(k70[0]);
            g00 += 8;
            g00[0] = float32_to_float16(k01[0]);
            g00[1] = float32_to_float16(k11[0]);
            g00[2] = float32_to_float16(k21[0]);
            g00[3] = float32_to_float16(k31[0]);
            g00[4] = float32_to_float16(k41[0]);
            g00[5] = float32_to_float16(k51[0]);
            g00[6] = float32_to_float16(k61[0]);
            g00[7] = float32_to_float16(k71[0]);

            g00 += 8;
            g00[0] = float32_to_float16(k02[0]);
            g00[1] = float32_to_float16(k12[0]);
            g00[2] = float32_to_float16(k22[0]);
            g00[3] = float32_to_float16(k32[0]);
            g00[4] = float32_to_float16(k42[0]);
            g00[5] = float32_to_float16(k52[0]);
            g00[6] = float32_to_float16(k62[0]);
            g00[7] = float32_to_float16(k72[0]);

            g00 += 8;
            g00[0] = float32_to_float16(k03[0]);
            g00[1] = float32_to_float16(k13[0]);
            g00[2] = float32_to_float16(k23[0]);
            g00[3] = float32_to_float16(k33[0]);
            g00[4] = float32_to_float16(k43[0]);
            g00[5] = float32_to_float16(k53[0]);
            g00[6] = float32_to_float16(k63[0]);
            g00[7] = float32_to_float16(k73[0]);

            g00 += 8;
            g00[0] = float32_to_float16(k04[0]);
            g00[1] = float32_to_float16(k14[0]);
            g00[2] = float32_to_float16(k24[0]);
            g00[3] = float32_to_float16(k34[0]);
            g00[4] = float32_to_float16(k44[0]);
            g00[5] = float32_to_float16(k54[0]);
            g00[6] = float32_to_float16(k64[0]);
            g00[7] = float32_to_float16(k74[0]);

            g00 += 8;
            g00[0] = float32_to_float16(k05[0]);
            g00[1] = float32_to_float16(k15[0]);
            g00[2] = float32_to_float16(k25[0]);
            g00[3] = float32_to_float16(k35[0]);
            g00[4] = float32_to_float16(k45[0]);
            g00[5] = float32_to_float16(k55[0]);
            g00[6] = float32_to_float16(k65[0]);
            g00[7] = float32_to_float16(k75[0]);

            g00 += 8;
            g00[0] = float32_to_float16(k06[0]);
            g00[1] = float32_to_float16(k16[0]);
            g00[2] = float32_to_float16(k26[0]);
            g00[3] = float32_to_float16(k36[0]);
            g00[4] = float32_to_float16(k46[0]);
            g00[5] = float32_to_float16(k56[0]);
            g00[6] = float32_to_float16(k66[0]);
            g00[7] = float32_to_float16(k76[0]);

            g00 += 8;
            g00[0] = float32_to_float16(k07[0]);
            g00[1] = float32_to_float16(k17[0]);
            g00[2] = float32_to_float16(k27[0]);
            g00[3] = float32_to_float16(k37[0]);
            g00[4] = float32_to_float16(k47[0]);
            g00[5] = float32_to_float16(k57[0]);
            g00[6] = float32_to_float16(k67[0]);
            g00[7] = float32_to_float16(k77[0]);

            g00 += 8;
        }
    }
}